

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall compiler::EmissionContext::Declare(EmissionContext *this,string *var)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  undefined1 local_40 [8];
  VariableDeclaration vd;
  string *var_local;
  EmissionContext *this_local;
  
  vd._32_8_ = var;
  VariableDeclaration::VariableDeclaration((VariableDeclaration *)local_40);
  std::__cxx11::string::operator=((string *)local_40,(string *)vd._32_8_);
  vd.value.field_2._M_local_buf[8] = '\0';
  uVar1 = this->firstFreeVariablesIndex;
  sVar2 = std::vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
          ::size(&this->variables);
  if (uVar1 < sVar2) {
    this_00 = std::
              vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
              ::at(&this->variables,this->firstFreeVariablesIndex);
    VariableDeclaration::operator=(this_00,(VariableDeclaration *)local_40);
  }
  else {
    std::vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>::
    push_back(&this->variables,(value_type *)local_40);
  }
  this->firstFreeVariablesIndex = this->firstFreeVariablesIndex + 1;
  VariableDeclaration::~VariableDeclaration((VariableDeclaration *)local_40);
  return;
}

Assistant:

void Declare(const std::string & var) {
    VariableDeclaration vd;
    vd.value = var;
    vd.isFullyBound = false;

    if (this->firstFreeVariablesIndex < this->variables.size()) {
      this->variables.at(this->firstFreeVariablesIndex) = vd;
    } else {
      this->variables.push_back(vd);
    }
    this->firstFreeVariablesIndex++;
  }